

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_block_native(CompilerGLSL *this,SPIRVariable *var)

{
  uint uVar1;
  __node_base_ptr p_Var2;
  byte bVar3;
  bool bVar4;
  uint32_t uVar5;
  mapped_type *pmVar6;
  ulong uVar7;
  SPIRType *pSVar8;
  mapped_type *this_00;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar9;
  bool local_261;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_258;
  bool local_248;
  bool local_246;
  bool local_244;
  bool local_242;
  bool local_229;
  string local_228 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [32];
  TypedID *local_1a0;
  TypedID<(spirv_cross::Types)1> *member;
  TypedID<(spirv_cross::Types)1> *__end1;
  TypedID<(spirv_cross::Types)1> *__begin1;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *__range1;
  char *pcStack_178;
  uint32_t i;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 local_150 [144];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_c0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_b8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_b0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a8;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_a0;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *block_namespace;
  string buffer_name;
  bool is_coherent;
  bool is_readonly;
  bool is_writeonly;
  bool is_restrict;
  undefined1 local_60 [7];
  bool ssbo;
  Bitset flags;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  flags.higher._M_h._M_single_bucket =
       (__node_base_ptr)Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar5);
  ParsedIR::get_buffer_block_flags((Bitset *)local_60,&(this->super_Compiler).ir,var);
  local_229 = true;
  if ((var->storage != StorageClassStorageBuffer) &&
     (local_229 = true, var->storage != StorageClassShaderRecordBufferKHR)) {
    pmVar6 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&(this->super_Compiler).ir.meta,
                          (key_type *)(flags.higher._M_h._M_single_bucket + 1));
    local_229 = Bitset::get(&(pmVar6->decoration).decoration_flags,3);
  }
  local_242 = false;
  if (local_229 != false) {
    local_242 = Bitset::get((Bitset *)local_60,0x13);
  }
  local_244 = false;
  if (local_229 != false) {
    local_244 = Bitset::get((Bitset *)local_60,0x19);
  }
  local_246 = false;
  if (local_229 != false) {
    local_246 = Bitset::get((Bitset *)local_60,0x18);
  }
  local_248 = false;
  if (local_229 != false) {
    local_248 = Bitset::get((Bitset *)local_60,0x17);
  }
  uVar5 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)(flags.higher._M_h._M_single_bucket + 1));
  (*(this->super_Compiler)._vptr_Compiler[6])(&block_namespace,this,(ulong)uVar5,0);
  if (local_229 == false) {
    local_258 = &this->block_ubo_names;
  }
  else {
    local_258 = &this->block_ssbo_names;
  }
  local_a0 = local_258;
  ::std::
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  ::operator[](&(this->super_Compiler).ir.meta,(key_type *)(flags.higher._M_h._M_single_bucket + 1))
  ;
  bVar3 = ::std::__cxx11::string::empty();
  local_261 = true;
  if ((bVar3 & 1) == 0) {
    local_a8._M_cur =
         (__node_type *)
         ::std::
         unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find(local_a0,(key_type *)&block_namespace);
    local_b0._M_cur =
         (__node_type *)
         ::std::
         end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                   (local_a0);
    bVar4 = ::std::__detail::operator!=(&local_a8,&local_b0);
    local_261 = true;
    if (!bVar4) {
      local_b8._M_cur =
           (__node_type *)
           ::std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&this->resource_names,(key_type *)&block_namespace);
      local_c0._M_cur =
           (__node_type *)
           ::std::
           end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                     (&this->resource_names);
      local_261 = ::std::__detail::operator!=(&local_b8,&local_c0);
    }
  }
  if (local_261 != false) {
    local_150._108_4_ = TypedID::operator_cast_to_TypedID((TypedID *)&(var->super_IVariant).self);
    (*(this->super_Compiler)._vptr_Compiler[4])
              (local_150 + 0x70,this,(ulong)(uint)local_150._108_4_);
    ::std::__cxx11::string::operator=((string *)&block_namespace,(string *)(local_150 + 0x70));
    ::std::__cxx11::string::~string((string *)(local_150 + 0x70));
  }
  add_variable(this,local_a0,&this->resource_names,(string *)&block_namespace);
  uVar7 = ::std::__cxx11::string::empty();
  if ((uVar7 & 1) != 0) {
    uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
    pSVar8 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,uVar5);
    join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&,char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>const&>
              ((spirv_cross *)(local_150 + 0x48),(char (*) [2])0x5eeb74,
               &(pSVar8->super_IVariant).self,(char (*) [2])0x5eeb74,&(var->super_IVariant).self);
    ::std::__cxx11::string::operator=((string *)&block_namespace,(string *)(local_150 + 0x48));
    ::std::__cxx11::string::~string((string *)(local_150 + 0x48));
  }
  pVar9 = ::std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->block_names,(value_type *)&block_namespace);
  local_150._56_8_ =
       pVar9.first.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur;
  local_150[0x40] = pVar9.second;
  pVar9 = ::std::
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(local_a0,(value_type *)&block_namespace);
  local_150._40_8_ =
       pVar9.first.
       super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
       ._M_cur;
  local_150[0x30] = pVar9.second;
  local_150._36_4_ = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  this_00 = ::std::
            unordered_map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[](&(this->super_Compiler).declared_block_names,(key_type *)(local_150 + 0x24)
                        );
  ::std::__cxx11::string::operator=((string *)this_00,(string *)&block_namespace);
  layout_for_variable_abi_cxx11_((CompilerGLSL *)local_150,(SPIRVariable *)this);
  local_170 = "";
  local_158 = "";
  if (local_248 != false) {
    local_158 = "coherent ";
  }
  local_160 = "";
  if (local_242 != false) {
    local_160 = "restrict ";
  }
  local_168 = "";
  if (local_244 != false) {
    local_168 = "writeonly ";
  }
  if (local_246 != false) {
    local_170 = "readonly ";
  }
  pcStack_178 = "uniform ";
  if (local_229 != false) {
    pcStack_178 = "buffer ";
  }
  statement<std::__cxx11::string,char_const*,char_const*,char_const*,char_const*,char_const*,std::__cxx11::string&>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
             &local_158,&local_160,&local_168,&local_170,&stack0xfffffffffffffe88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&block_namespace);
  ::std::__cxx11::string::~string((string *)local_150);
  begin_scope(this);
  ::std::
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(flags.higher._M_h._M_single_bucket + 0x23));
  __range1._4_4_ = 0;
  __begin1 = (TypedID<(spirv_cross::Types)1> *)(flags.higher._M_h._M_single_bucket + 0x11);
  __end1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::begin
                     ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin1);
  member = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::end
                     ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin1);
  for (; __end1 != member; __end1 = __end1 + 1) {
    local_1a0 = (TypedID *)__end1;
    add_member_name(this,(SPIRType *)flags.higher._M_h._M_single_bucket,__range1._4_4_);
    p_Var2 = flags.higher._M_h._M_single_bucket;
    uVar5 = TypedID::operator_cast_to_unsigned_int(local_1a0);
    uVar1 = __range1._4_4_;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_1c0,"",&local_1c1);
    (*(this->super_Compiler)._vptr_Compiler[0x15])
              (this,p_Var2,(ulong)uVar5,(ulong)uVar1,local_1c0,0);
    ::std::__cxx11::string::~string(local_1c0);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
    __range1._4_4_ = __range1._4_4_ + 1;
  }
  uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  preserve_alias_on_reset(this,uVar5);
  uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  add_resource_name(this,uVar5);
  uVar5 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  (*(this->super_Compiler)._vptr_Compiler[6])(local_208,this,(ulong)uVar5,1);
  (*(this->super_Compiler)._vptr_Compiler[0x26])(local_228,this,flags.higher._M_h._M_single_bucket);
  ::std::operator+(local_1e8,local_208);
  end_scope_decl(this,local_1e8);
  ::std::__cxx11::string::~string((string *)local_1e8);
  ::std::__cxx11::string::~string(local_228);
  ::std::__cxx11::string::~string((string *)local_208);
  statement<char_const(&)[1]>(this,(char (*) [1])0x5df766);
  ::std::__cxx11::string::~string((string *)&block_namespace);
  Bitset::~Bitset((Bitset *)local_60);
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_block_native(const SPIRVariable &var)
{
	auto &type = get<SPIRType>(var.basetype);

	Bitset flags = ir.get_buffer_block_flags(var);
	bool ssbo = var.storage == StorageClassStorageBuffer || var.storage == StorageClassShaderRecordBufferKHR ||
	            ir.meta[type.self].decoration.decoration_flags.get(DecorationBufferBlock);
	bool is_restrict = ssbo && flags.get(DecorationRestrict);
	bool is_writeonly = ssbo && flags.get(DecorationNonReadable);
	bool is_readonly = ssbo && flags.get(DecorationNonWritable);
	bool is_coherent = ssbo && flags.get(DecorationCoherent);

	// Block names should never alias, but from HLSL input they kind of can because block types are reused for UAVs ...
	auto buffer_name = to_name(type.self, false);

	auto &block_namespace = ssbo ? block_ssbo_names : block_ubo_names;

	// Shaders never use the block by interface name, so we don't
	// have to track this other than updating name caches.
	// If we have a collision for any reason, just fallback immediately.
	if (ir.meta[type.self].decoration.alias.empty() || block_namespace.find(buffer_name) != end(block_namespace) ||
	    resource_names.find(buffer_name) != end(resource_names))
	{
		buffer_name = get_block_fallback_name(var.self);
	}

	// Make sure we get something unique for both global name scope and block name scope.
	// See GLSL 4.5 spec: section 4.3.9 for details.
	add_variable(block_namespace, resource_names, buffer_name);

	// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
	// This cannot conflict with anything else, so we're safe now.
	// We cannot reuse this fallback name in neither global scope (blocked by block_names) nor block name scope.
	if (buffer_name.empty())
		buffer_name = join("_", get<SPIRType>(var.basetype).self, "_", var.self);

	block_names.insert(buffer_name);
	block_namespace.insert(buffer_name);

	// Save for post-reflection later.
	declared_block_names[var.self] = buffer_name;

	statement(layout_for_variable(var), is_coherent ? "coherent " : "", is_restrict ? "restrict " : "",
	          is_writeonly ? "writeonly " : "", is_readonly ? "readonly " : "", ssbo ? "buffer " : "uniform ",
	          buffer_name);

	begin_scope();

	type.member_name_cache.clear();

	uint32_t i = 0;
	for (auto &member : type.member_types)
	{
		add_member_name(type, i);
		emit_struct_member(type, member, i);
		i++;
	}

	// var.self can be used as a backup name for the block name,
	// so we need to make sure we don't disturb the name here on a recompile.
	// It will need to be reset if we have to recompile.
	preserve_alias_on_reset(var.self);
	add_resource_name(var.self);
	end_scope_decl(to_name(var.self) + type_to_array_glsl(type));
	statement("");
}